

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.h
# Opt level: O1

void __thiscall Box::Box(Box *this,Vector *l,Vector *s1,Vector *s2,Vector *s3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  GeometricObject::GeometricObject(&this->super_GeometricObject);
  (this->super_GeometricObject)._vptr_GeometricObject = (_func_int **)&PTR__GeometricObject_0010bad8
  ;
  dVar1 = l->x;
  (this->loc).x = dVar1;
  dVar2 = l->y;
  (this->loc).y = dVar2;
  dVar3 = l->z;
  (this->loc).z = dVar3;
  dVar4 = s1->x;
  (this->e1).x = dVar4;
  dVar5 = s1->y;
  (this->e1).y = dVar5;
  dVar6 = s1->z;
  (this->e1).z = dVar6;
  dVar7 = s2->x;
  (this->e2).x = dVar7;
  dVar8 = s2->y;
  (this->e2).y = dVar8;
  dVar9 = s2->z;
  (this->e2).z = dVar9;
  dVar10 = s3->x;
  (this->e3).x = dVar10;
  dVar11 = s3->y;
  (this->e3).y = dVar11;
  dVar12 = s3->z;
  (this->e3).z = dVar12;
  (this->center).x = (dVar4 + dVar7 + dVar10) * 0.5 + dVar1;
  (this->center).y = (dVar5 + dVar8 + dVar11) * 0.5 + dVar2;
  (this->center).z = (dVar6 + dVar9 + dVar12) * 0.5 + dVar3;
  init_normals(this);
  return;
}

Assistant:

Box(Vector const& l, Vector const& s1, Vector const& s2, Vector const& s3)
        : loc( l )
        , e1( s1 )
        , e2( s2 )
        , e3( s3 )
    {
        center = loc + (e1 + e2 + e3) * 0.5;
        init_normals();
    }